

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O3

ON__UINT64 __thiscall ON_Buffer::Read(ON_Buffer *this,ON__UINT64 size,void *buffer)

{
  ulong uVar1;
  bool bVar2;
  ON_BUFFER_SEGMENT *pOVar3;
  ON__UINT64 OVar4;
  char *sFormat;
  ON__UINT64 OVar5;
  int line_number;
  ulong uVar6;
  ulong __n;
  
  if (size != 0) {
    if (buffer == (void *)0x0) {
      sFormat = "size parameter > 0 and buffer parameter is null.";
      line_number = 0x465;
    }
    else if (this->m_current_position < this->m_buffer_size) {
      bVar2 = SetCurrentSegment(this,false);
      if (bVar2) {
        pOVar3 = this->m_current_segment;
        if (pOVar3 != (ON_BUFFER_SEGMENT *)0x0) {
          OVar5 = 0;
          do {
            if (pOVar3->m_segment_buffer == (uchar *)0x0) break;
            uVar6 = pOVar3->m_segment_position1;
            if (this->m_buffer_size < pOVar3->m_segment_position1) {
              uVar6 = this->m_buffer_size;
            }
            uVar1 = this->m_current_position;
            if ((uVar1 < pOVar3->m_segment_position0) ||
               (__n = uVar6 - uVar1, uVar6 < uVar1 || __n == 0)) {
              sFormat = "Corrupt ON_Buffer";
              line_number = 0x48c;
              goto LAB_0045a140;
            }
            if (size <= __n) {
              __n = size;
            }
            memcpy(buffer,pOVar3->m_segment_buffer + (uVar1 - pOVar3->m_segment_position0),__n);
            OVar4 = this->m_current_position + __n;
            this->m_current_position = OVar4;
            OVar5 = OVar5 + __n;
            size = size - __n;
            if (size == 0) {
              return OVar5;
            }
            if ((OVar4 == this->m_buffer_size) && (this->m_current_segment == this->m_last_segment))
            {
              return OVar5;
            }
            buffer = (void *)((long)buffer + __n);
            pOVar3 = this->m_current_segment->m_next_segment;
            this->m_current_segment = pOVar3;
          } while (pOVar3 != (ON_BUFFER_SEGMENT *)0x0);
        }
        sFormat = "Corrupt ON_Buffer";
        line_number = 0x482;
      }
      else {
        sFormat = "Corrupt ON_Buffer";
        line_number = 0x479;
      }
    }
    else {
      if (this->m_current_position <= this->m_buffer_size) {
        return 0;
      }
      sFormat = "Read attempted when current position > buffer size.";
      line_number = 0x472;
    }
LAB_0045a140:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
               ,line_number,"",sFormat);
  }
  return 0;
}

Assistant:

ON__UINT64 ON_Buffer::Read( ON__UINT64 size, void* buffer )
{
  if ( 0 == size )
  {
    // not an error condition
    return 0;
  }

  if ( 0 == buffer )
  {
    // ON_Buffer error
    ON_ERROR("size parameter > 0 and buffer parameter is null.");
    return 0;
  }

  if ( m_current_position >= m_buffer_size )
  {
    // m_current_position == m_buffer_size is a common situation
    // and is not an error condition.
    // For example, it occurs when a previous Read() read up to the
    // end of the buffer and the caller is testing the number of 
    // bytes read to detect the end of buffer condition.
    if ( m_current_position > m_buffer_size )
    {
      ON_ERROR("Read attempted when current position > buffer size.");
    }
    return 0;
  }

  if ( !SetCurrentSegment(false) )
  {
    ON_ERROR("Corrupt ON_Buffer");
    return 0;
  }

  ON__UINT64 rc = 0;
  while ( size > 0 )
  {
    if( 0 == m_current_segment || 0 == m_current_segment->m_segment_buffer )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return 0;
    }

    // set pos1 to the maximum position to be read from m_current_segment.
    ON__UINT64 pos1 = (m_buffer_size < m_current_segment->m_segment_position1)
                    ? m_buffer_size
                    : m_current_segment->m_segment_position1;
    if ( m_current_position < m_current_segment->m_segment_position0 || m_current_position >= pos1 )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return 0;
    }

    ON__UINT64 offset = m_current_position - m_current_segment->m_segment_position0;           
    ON__UINT64 sz = pos1 - m_current_position;

    if ( sz > size )
      sz = size;
    memcpy( buffer, m_current_segment->m_segment_buffer + offset, (size_t)sz );
    m_current_position += sz;
    rc += sz;
    size -= sz;
    buffer = ((unsigned char*)buffer) + sz;
    if ( size > 0 )
    {
      if ( m_current_position == m_buffer_size && m_current_segment == m_last_segment )
      {
        // This is a common situation that occurs when the read request is for a
        // size larger than the remaining number of bytes in the buffer. For example,
        // when repeatedly reading into a fixed size buffer until reaching the end
        // of the file. This is not an error condition.
        break;
      }
      m_current_segment = m_current_segment->m_next_segment;
    }
  }

  return rc;
}